

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_int_2_suite::test_ctor(void)

{
  undefined4 local_68;
  value_type_conflict1 local_64 [2];
  undefined4 local_5c;
  size_type local_58;
  undefined1 local_4a;
  undefined1 local_49 [2];
  undefined1 local_47;
  undefined1 local_46 [2];
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  moment<int,_2> filter;
  
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_40[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::capacity
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_44 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x18d,"void mean_int_2_suite::test_ctor()",local_40,&local_44);
  local_46[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::empty
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_47 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x18e,"void mean_int_2_suite::test_ctor()",local_46,&local_47);
  local_49[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::full
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,399,"void mean_int_2_suite::test_ctor()",local_49,&local_4a);
  local_58 = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,400,"void mean_int_2_suite::test_ctor()",&local_58,&local_5c);
  local_64[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x191,"void mean_int_2_suite::test_ctor()",local_64,&local_68);
  return;
}

Assistant:

void test_ctor()
{
    window::moment<int, 2> filter;
    TRIAL_TEST_EQ(filter.capacity(), 2);
    TRIAL_TEST_EQ(filter.empty(), true);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 0);
    TRIAL_TEST_EQ(filter.mean(), 0);
}